

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_Vx_annotation.cpp
# Opt level: O2

ON_DimLinear *
ON_DimLinear::CreateFromV5DimLinear
          (ON_OBSOLETE_V5_DimLinear *V5_dim_linear,ON_3dmAnnotationContext *annotation_context,
          ON_DimLinear *destination)

{
  double distance_scale;
  V5_eAnnotationType VVar1;
  bool bVar2;
  ON_Plane *pOVar3;
  wchar_t *pwVar4;
  ON_OBSOLETE_V5_DimExtra *this;
  ON_DimStyle *pOVar5;
  long lVar6;
  ON_OBSOLETE_V5_Annotation *V5_annotation;
  ON_Plane *pOVar7;
  byte bVar8;
  ON_UUID OVar9;
  ON_2dPoint OVar10;
  ON_2dPoint OVar11;
  ON_2dPoint OVar12;
  ON_2dPoint OVar13;
  AnnotationType local_1a1;
  ON_wString usrtext;
  ON_wString dimtext;
  ON_3dVector horizontal;
  ON_3dPoint arrow2point;
  ON_3dPoint arrow1point;
  ON_Plane plane;
  ON_3dPoint dimlinepoint;
  ON_3dPoint def2point;
  ON_3dPoint def1point;
  
  bVar8 = 0;
  VVar1 = ON_OBSOLETE_V5_Annotation::Type(&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation);
  if (VVar1 == dtDimAligned) {
    local_1a1 = Aligned;
  }
  else {
    if (VVar1 != dtDimLinear) {
      return (ON_DimLinear *)0x0;
    }
    local_1a1 = Rotated;
  }
  if (annotation_context == (ON_3dmAnnotationContext *)0x0) {
    annotation_context = &ON_3dmAnnotationContext::Default;
  }
  if (destination == (ON_DimLinear *)0x0) {
    destination = (ON_DimLinear *)operator_new(0x390);
    ON_DimLinear(destination);
  }
  OVar10 = ON_OBSOLETE_V5_Annotation::Point(&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation,1);
  OVar11 = ON_OBSOLETE_V5_Annotation::Point(&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation,3);
  OVar12 = ON_OBSOLETE_V5_Annotation::Point(&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation,0);
  OVar13 = ON_OBSOLETE_V5_Annotation::Point(&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation,2);
  pOVar3 = ON_OBSOLETE_V5_Annotation::Plane(&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation);
  pOVar7 = &plane;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pOVar7->origin).x = (pOVar3->origin).x;
    pOVar3 = (ON_Plane *)((long)pOVar3 + (ulong)bVar8 * -0x10 + 8);
    pOVar7 = (ON_Plane *)((long)pOVar7 + (ulong)bVar8 * -0x10 + 8);
  }
  pwVar4 = ON_OBSOLETE_V5_Annotation::TextValue(&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation);
  ON_wString::ON_wString(&dimtext,pwVar4);
  ON_Plane::PointAt(&def1point,&plane,OVar12.x,OVar12.y);
  ON_Plane::PointAt(&def2point,&plane,OVar13.x,OVar13.y);
  ON_Plane::PointAt(&arrow1point,&plane,OVar10.x,OVar10.y);
  ON_Plane::PointAt(&arrow2point,&plane,OVar11.x,OVar11.y);
  ON_3dPoint::operator+((ON_3dPoint *)&horizontal,&arrow1point,&arrow2point);
  ON_3dPoint::operator/(&dimlinepoint,(ON_3dPoint *)&horizontal,2.0);
  horizontal.z = ON_3dVector::XAxis.z;
  horizontal.x = ON_3dVector::XAxis.x;
  horizontal.y = ON_3dVector::XAxis.y;
  OVar9 = ON_3dmAnnotationContext::ParentDimStyleId(annotation_context);
  V5_annotation = (ON_OBSOLETE_V5_Annotation *)(ulong)local_1a1;
  Create(destination,local_1a1,OVar9,&plane,&horizontal,&def1point,&def2point,&dimlinepoint,0.0);
  ON_Annotation::Internal_SetDimStyleFromV5Annotation
            ((ON_Annotation *)destination,V5_annotation,annotation_context);
  OVar10 = ON_OBSOLETE_V5_Annotation::Point(&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation,4);
  usrtext.m_s = (wchar_t *)OVar10.x;
  ON_Dimension::Set2dTextPoint(&destination->super_ON_Dimension,(ON_2dPoint *)&usrtext);
  bVar2 = ON_OBSOLETE_V5_Annotation::UserPositionedText
                    (&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation);
  (*(destination->super_ON_Dimension).super_ON_Annotation.super_ON_Geometry.super_ON_Object.
    _vptr_ON_Object[0x2c])(destination,(ulong)!bVar2);
  pwVar4 = ON_OBSOLETE_V5_Annotation::TextFormula(&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation);
  ON_wString::ON_wString(&usrtext,pwVar4);
  ON_wString::Replace(&usrtext,L"\\",L"\\\\");
  pwVar4 = ON_wString::Array(&usrtext);
  ON_Dimension::SetUserText(&destination->super_ON_Dimension,pwVar4);
  this = ON_OBSOLETE_V5_DimExtra::DimensionExtension(V5_dim_linear,false);
  if (this != (ON_OBSOLETE_V5_DimExtra *)0x0) {
    OVar9 = ON_OBSOLETE_V5_DimExtra::DetailMeasured(this);
    ON_Dimension::SetDetailMeasured(&destination->super_ON_Dimension,OVar9);
    distance_scale = ON_OBSOLETE_V5_DimExtra::DistanceScale(this);
    ON_Dimension::SetDistanceScale(&destination->super_ON_Dimension,distance_scale);
  }
  pOVar5 = ON_3dmAnnotationContext::ParentDimStyle(annotation_context);
  ON_DimStyle::ContentHash(pOVar5);
  pOVar5 = ON_Annotation::DimensionStyle((ON_Annotation *)destination,pOVar5);
  ON_DimStyle::ContentHash(pOVar5);
  ON_wString::~ON_wString(&usrtext);
  ON_wString::~ON_wString(&dimtext);
  ON_Plane::~ON_Plane(&plane);
  return destination;
}

Assistant:

ON_DimLinear* ON_DimLinear::CreateFromV5DimLinear(
    const class ON_OBSOLETE_V5_DimLinear& V5_dim_linear,
    const class ON_3dmAnnotationContext* annotation_context,
    ON_DimLinear* destination
  )
{
  ON::AnnotationType v6type;
  ON_INTERNAL_OBSOLETE::V5_eAnnotationType dimtype = V5_dim_linear.Type();
  if (dimtype == ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned)
    v6type = ON::AnnotationType::Aligned;
  else  if (dimtype == ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear)
    v6type = ON::AnnotationType::Rotated;
  else
    return nullptr;

  if (nullptr == annotation_context)
    annotation_context = &ON_3dmAnnotationContext::Default;

  ON_DimLinear* V6_dim_linear
    = (nullptr != destination)
    ? destination
    : new ON_DimLinear();

  ON_2dPoint arrow1 = V5_dim_linear.Point(ON_OBSOLETE_V5_DimLinear::POINT_INDEX::arrow0_pt_index);
  ON_2dPoint arrow2 = V5_dim_linear.Point(ON_OBSOLETE_V5_DimLinear::POINT_INDEX::arrow1_pt_index);
  ON_2dPoint defpt1 = V5_dim_linear.Point(ON_OBSOLETE_V5_DimLinear::POINT_INDEX::ext0_pt_index);
  ON_2dPoint defpt2 = V5_dim_linear.Point(ON_OBSOLETE_V5_DimLinear::POINT_INDEX::ext1_pt_index);
  //ON_2dPoint textpt = V5_dim_linear.Point(ON_OBSOLETE_V5_DimLinear::POINT_INDEX::userpositionedtext_pt_index);
  ON_Plane plane = V5_dim_linear.Plane();
  ON_wString dimtext = V5_dim_linear.TextValue();

  ON_3dPoint def1point = plane.PointAt(defpt1.x, defpt1.y);
  ON_3dPoint def2point = plane.PointAt(defpt2.x, defpt2.y);
  ON_3dPoint arrow1point = plane.PointAt(arrow1.x, arrow1.y);
  ON_3dPoint arrow2point = plane.PointAt(arrow2.x, arrow2.y);
  ON_3dPoint dimlinepoint = (arrow1point + arrow2point) / 2.0;
  //ON_3dPoint textpoint = plane.PointAt(textpt.x, textpt.y);
  ON_3dVector horizontal = ON_3dVector::XAxis;

  const ON_UUID dim_style_id = annotation_context->ParentDimStyleId();
  V6_dim_linear->Create(v6type, dim_style_id, plane, horizontal, def1point, def2point, dimlinepoint, 0.0);
  V6_dim_linear->Internal_SetDimStyleFromV5Annotation(V5_dim_linear,annotation_context);
  V6_dim_linear->Set2dTextPoint(V5_dim_linear.Point(ON_OBSOLETE_V5_DimLinear::POINT_INDEX::userpositionedtext_pt_index));
  V6_dim_linear->SetUseDefaultTextPoint(!V5_dim_linear.UserPositionedText());
  ON_wString usrtext = V5_dim_linear.TextFormula();
  usrtext.Replace(L"\\", L"\\\\");
  V6_dim_linear->SetUserText(usrtext.Array());

  const ON_OBSOLETE_V5_DimExtra* extra = ON_OBSOLETE_V5_DimExtra::DimensionExtension(const_cast<ON_OBSOLETE_V5_DimLinear*>(&V5_dim_linear), false);
  if(nullptr != extra)
  {
    V6_dim_linear->SetDetailMeasured(extra->DetailMeasured());
    V6_dim_linear->SetDistanceScale(extra->DistanceScale());        
  }

  // updates any m_overrides to be current and updates content hash.
  const ON_DimStyle& parent_dim_style = annotation_context->ParentDimStyle();
  parent_dim_style.ContentHash();
  V6_dim_linear->DimensionStyle(parent_dim_style).ContentHash();

  return V6_dim_linear;
}